

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct8x8_low1_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  int32_t iVar1;
  int iVar2;
  int iVar3;
  int32_t *piVar4;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  uint in_R9D;
  uint uVar5;
  uint uVar7;
  uint uVar8;
  undefined1 auVar6 [16];
  uint uVar9;
  __m128i offset;
  int log_range_out;
  __m128i x;
  __m128i clamp_hi;
  __m128i clamp_lo;
  int log_range;
  __m128i rnding;
  __m128i cospi32;
  int32_t *cospi;
  char local_2a0;
  char local_29c;
  undefined8 local_278;
  undefined8 uStack_270;
  int iStack_25c;
  int iStack_24c;
  byte local_210;
  char local_204;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  
  piVar4 = cospi_arr(in_EDX);
  iVar1 = piVar4[0x20];
  auVar6._4_4_ = iVar1;
  auVar6._0_4_ = iVar1;
  auVar6._12_4_ = iVar1;
  auVar6._8_4_ = iVar1;
  local_204 = (char)in_EDX;
  iVar2 = 1 << (local_204 - 1U & 0x1f);
  iVar3 = 8;
  if (in_ECX != 0) {
    iVar3 = 6;
  }
  if (in_R8D + iVar3 < 0x10) {
    local_29c = '\x10';
  }
  else {
    local_29c = '\b';
    if (in_ECX != 0) {
      local_29c = '\x06';
    }
    local_29c = (char)in_R8D + local_29c;
  }
  auVar6 = pmulld(*in_RDI,auVar6);
  local_1a8 = auVar6._0_4_;
  iStack_1a4 = auVar6._4_4_;
  iStack_1a0 = auVar6._8_4_;
  iStack_19c = auVar6._12_4_;
  auVar6 = ZEXT416(in_EDX);
  local_278._0_4_ = local_1a8 + iVar2 >> auVar6;
  local_278._4_4_ = iStack_1a4 + iVar2 >> auVar6;
  uStack_270._0_4_ = iStack_1a0 + iVar2 >> auVar6;
  uStack_270._4_4_ = iStack_19c + iVar2 >> auVar6;
  if (in_ECX == 0) {
    if (in_R8D + 6 < 0x10) {
      local_2a0 = '\x10';
    }
    else {
      local_2a0 = (char)in_R8D + '\x06';
    }
    local_210 = (byte)in_R9D;
    iVar2 = (1 << (local_210 & 0x1f)) >> 1;
    auVar6 = ZEXT416(in_R9D);
    local_278._4_4_ = local_278._4_4_ + iVar2 >> auVar6;
    local_278._0_4_ = (int)local_278 + iVar2 >> auVar6;
    uStack_270._0_4_ = (int)uStack_270 + iVar2 >> auVar6;
    uStack_270._4_4_ = uStack_270._4_4_ + iVar2 >> auVar6;
    local_29c = local_2a0;
  }
  iStack_25c = (1 << (local_29c - 1U & 0x1f)) + -1;
  iStack_24c = -(1 << (local_29c - 1U & 0x1f));
  local_68 = (int)local_278;
  iStack_64 = local_278._4_4_;
  iStack_60 = local_278._8_4_;
  iStack_5c = local_278._12_4_;
  uVar5 = (uint)(local_68 < iStack_24c) * iStack_24c | (uint)(local_68 >= iStack_24c) * local_68;
  uVar7 = (uint)(iStack_64 < iStack_24c) * iStack_24c | (uint)(iStack_64 >= iStack_24c) * iStack_64;
  uVar8 = (uint)(iStack_60 < iStack_24c) * iStack_24c | (uint)(iStack_60 >= iStack_24c) * iStack_60;
  uVar9 = (uint)(iStack_5c < iStack_24c) * iStack_24c | (uint)(iStack_5c >= iStack_24c) * iStack_5c;
  local_278 = CONCAT44((uint)(iStack_25c < (int)uVar7) * iStack_25c |
                       (iStack_25c >= (int)uVar7) * uVar7,
                       (uint)(iStack_25c < (int)uVar5) * iStack_25c |
                       (iStack_25c >= (int)uVar5) * uVar5);
  uStack_270._0_4_ =
       (uint)(iStack_25c < (int)uVar8) * iStack_25c | (iStack_25c >= (int)uVar8) * uVar8;
  uStack_270._4_4_ =
       (uint)(iStack_25c < (int)uVar9) * iStack_25c | (iStack_25c >= (int)uVar9) * uVar9;
  *in_RSI = local_278;
  in_RSI[1] = uStack_270;
  in_RSI[2] = local_278;
  in_RSI[3] = uStack_270;
  in_RSI[4] = local_278;
  in_RSI[5] = uStack_270;
  in_RSI[6] = local_278;
  in_RSI[7] = uStack_270;
  in_RSI[8] = local_278;
  in_RSI[9] = uStack_270;
  in_RSI[10] = local_278;
  in_RSI[0xb] = uStack_270;
  in_RSI[0xc] = local_278;
  in_RSI[0xd] = uStack_270;
  in_RSI[0xe] = local_278;
  in_RSI[0xf] = uStack_270;
  return;
}

Assistant:

static void idct8x8_low1_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                                int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i x;

  // stage 0
  // stage 1
  // stage 2
  // stage 3
  x = _mm_mullo_epi32(in[0], cospi32);
  x = _mm_add_epi32(x, rnding);
  x = _mm_srai_epi32(x, bit);

  // stage 4
  // stage 5
  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    clamp_lo = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    clamp_hi = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    __m128i offset = _mm_set1_epi32((1 << out_shift) >> 1);
    x = _mm_add_epi32(x, offset);
    x = _mm_sra_epi32(x, _mm_cvtsi32_si128(out_shift));
  }

  x = _mm_max_epi32(x, clamp_lo);
  x = _mm_min_epi32(x, clamp_hi);
  out[0] = x;
  out[1] = x;
  out[2] = x;
  out[3] = x;
  out[4] = x;
  out[5] = x;
  out[6] = x;
  out[7] = x;
}